

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  ImU32 seed;
  ImGuiID id;
  uint *puVar1;
  ImRect r_rel;
  
  puVar1 = ImVector<unsigned_int>::back(&this->IDStack);
  seed = *puVar1;
  r_rel = ImGui::WindowRectAbsToRel(this,r_abs);
  id = ImHashData(&r_rel,0x10,seed);
  ImGui::KeepAliveID(id);
  return id;
}

Assistant:

ImGuiID ImGuiWindow::GetIDFromRectangle(const ImRect& r_abs)
{
    ImGuiID seed = IDStack.back();
    ImRect r_rel = ImGui::WindowRectAbsToRel(this, r_abs);
    ImGuiID id = ImHashData(&r_rel, sizeof(r_rel), seed);
    ImGui::KeepAliveID(id);
    return id;
}